

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall wasm::PrintSExpression::visitExport(PrintSExpression *this,Export *curr)

{
  const_pointer str;
  ostream *poVar1;
  Name name;
  Export *curr_local;
  PrintSExpression *this_local;
  
  std::operator<<(this->o,'(');
  printMedium(this->o,"export ");
  poVar1 = this->o;
  str = std::basic_string_view<char,_std::char_traits<char>_>::data
                  ((basic_string_view<char,_std::char_traits<char>_> *)curr);
  poVar1 = printText(poVar1,str);
  std::operator<<(poVar1," (");
  switch(curr->kind) {
  case Function:
    std::operator<<(this->o,"func");
    break;
  case Table:
    std::operator<<(this->o,"table");
    break;
  case Memory:
    std::operator<<(this->o,"memory");
    break;
  case Global:
    std::operator<<(this->o,"global");
    break;
  case Tag:
    std::operator<<(this->o,"tag");
    break;
  case Invalid:
    handle_unreachable("invalid ExternalKind",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Print.cpp"
                       ,0xbfe);
  }
  std::operator<<(this->o,' ');
  poVar1 = (ostream *)(curr->value).super_IString.str._M_str;
  name.super_IString.str._M_str = (char *)this->o;
  name.super_IString.str._M_len = (size_t)poVar1;
  poVar1 = anon_unknown_217::printName
                     ((anon_unknown_217 *)(curr->value).super_IString.str._M_len,name,poVar1);
  std::operator<<(poVar1,"))");
  return;
}

Assistant:

void visitExport(Export* curr) {
    o << '(';
    printMedium(o, "export ");
    // TODO: Escape the string properly.
    printText(o, curr->name.str.data()) << " (";
    switch (curr->kind) {
      case ExternalKind::Function:
        o << "func";
        break;
      case ExternalKind::Table:
        o << "table";
        break;
      case ExternalKind::Memory:
        o << "memory";
        break;
      case ExternalKind::Global:
        o << "global";
        break;
      case ExternalKind::Tag:
        o << "tag";
        break;
      case ExternalKind::Invalid:
        WASM_UNREACHABLE("invalid ExternalKind");
    }
    o << ' ';
    printName(curr->value, o) << "))";
  }